

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_99087a::HandleRemoveAtCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  cmMakefile *this;
  bool bVar2;
  cmList *this_00;
  ulong uVar3;
  long lVar4;
  size_t i;
  string *var;
  string_view value;
  int index;
  vector<long,_std::allocator<long>_> removed;
  optional<cmList> list;
  ostringstream str;
  size_t local_1a0;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x41) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&str,"sub-command REMOVE_AT requires at least two arguments.",
               (allocator<char> *)&list);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&str);
    bVar2 = false;
  }
  else {
    var = pbVar1 + 1;
    GetList(&list,var,status->Makefile);
    if ((list.super__Optional_base<cmList,_false,_false>._M_payload.
         super__Optional_payload<cmList,_true,_false,_false>.super__Optional_payload_base<cmList>.
         _M_engaged == true) &&
       (list.super__Optional_base<cmList,_false,_false>._M_payload.
        super__Optional_payload<cmList,_true,_false,_false>.super__Optional_payload_base<cmList>.
        _M_payload._M_value.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        list.super__Optional_base<cmList,_false,_false>._M_payload.
        super__Optional_payload<cmList,_true,_false,_false>.super__Optional_payload_base<cmList>.
        _M_payload._M_value.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      removed.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      removed.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      removed.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      lVar4 = 0x40;
      for (uVar3 = 2;
          pbVar1 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start,
          uVar3 < (ulong)((long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
          uVar3 = uVar3 + 1) {
        bVar2 = GetIndexArg((string *)((long)&(pbVar1->_M_dataplus)._M_p + lVar4),&index,
                            status->Makefile);
        if (!bVar2) {
          cmStrCat<char_const(&)[8],std::__cxx11::string_const&,char_const(&)[22]>
                    ((string *)&str,(char (*) [8])0x6896fa,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&(((args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                     lVar4),(char (*) [22])0x6d451a);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          std::__cxx11::string::~string((string *)&str);
          bVar2 = false;
          goto LAB_002ad081;
        }
        _str = (pointer)(long)index;
        std::vector<long,_std::allocator<long>_>::emplace_back<long>(&removed,(long *)&str);
        lVar4 = lVar4 + 0x20;
      }
      this = status->Makefile;
      this_00 = cmList::
                remove_items<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>>
                          ((cmList *)&list,
                           (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
                           removed.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
                           removed.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_finish);
      cmList::to_string_abi_cxx11_((string *)&str,this_00);
      value._M_str = _str;
      value._M_len = local_1a0;
      cmMakefile::AddDefinition(this,var,value);
      std::__cxx11::string::~string((string *)&str);
      bVar2 = true;
LAB_002ad081:
      std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                (&removed.super__Vector_base<long,_std::allocator<long>_>);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&str);
      std::operator<<((ostream *)&str,"index: ");
      lVar4 = 0x20;
      for (uVar3 = 1;
          pbVar1 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start,
          uVar3 < (ulong)((long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
          uVar3 = uVar3 + 1) {
        std::operator<<((ostream *)&str,(string *)((long)&(pbVar1->_M_dataplus)._M_p + lVar4));
        if (uVar3 != ((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) {
          std::operator<<((ostream *)&str,", ");
        }
        lVar4 = lVar4 + 0x20;
      }
      std::operator<<((ostream *)&str," out of range (0, 0)");
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_assign((string *)&status->Error);
      std::__cxx11::string::~string((string *)&removed);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&str);
      bVar2 = false;
    }
    std::_Optional_payload_base<cmList>::_M_reset((_Optional_payload_base<cmList> *)&list);
  }
  return bVar2;
}

Assistant:

bool HandleRemoveAtCommand(std::vector<std::string> const& args,
                           cmExecutionStatus& status)
{
  if (args.size() < 3) {
    status.SetError("sub-command REMOVE_AT requires at least "
                    "two arguments.");
    return false;
  }

  const std::string& listName = args[1];
  // expand the variable
  auto list = GetList(listName, status.GetMakefile());

  if (!list || list->empty()) {
    std::ostringstream str;
    str << "index: ";
    for (size_t i = 1; i < args.size(); ++i) {
      str << args[i];
      if (i != args.size() - 1) {
        str << ", ";
      }
    }
    str << " out of range (0, 0)";
    status.SetError(str.str());
    return false;
  }

  size_t cc;
  std::vector<cmList::index_type> removed;
  for (cc = 2; cc < args.size(); ++cc) {
    int index;
    if (!GetIndexArg(args[cc], &index, status.GetMakefile())) {
      status.SetError(cmStrCat("index: ", args[cc], " is not a valid index"));
      return false;
    }
    removed.push_back(index);
  }

  try {
    status.GetMakefile().AddDefinition(
      listName,
      list->remove_items(removed.begin(), removed.end()).to_string());
    return true;
  } catch (std::out_of_range& e) {
    status.SetError(e.what());
    return false;
  }
}